

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O0

ostream * toml::operator<<(ostream *os,integer_format f)

{
  ostream *poVar1;
  uchar in_SIL;
  ostream *in_RDI;
  
  switch(in_SIL) {
  case '\0':
    std::operator<<(in_RDI,"dec");
    break;
  case '\x01':
    std::operator<<(in_RDI,"bin");
    break;
  case '\x02':
    std::operator<<(in_RDI,"oct");
    break;
  case '\x03':
    std::operator<<(in_RDI,"hex");
    break;
  default:
    poVar1 = std::operator<<(in_RDI,"unknown integer_format: ");
    std::operator<<(poVar1,in_SIL);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const integer_format f)
{
    switch(f)
    {
        case integer_format::dec: {os << "dec"; break;}
        case integer_format::bin: {os << "bin"; break;}
        case integer_format::oct: {os << "oct"; break;}
        case integer_format::hex: {os << "hex"; break;}
        default:
        {
            os << "unknown integer_format: " << static_cast<std::uint8_t>(f);
            break;
        }
    }
    return os;
}